

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

absolute_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::BreakTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,time_point<seconds> *tp)

{
  Transition *unix_time_00;
  size_type sVar1;
  const_reference pvVar2;
  const_reference tt;
  Transition *pTVar3;
  civil_second cVar4;
  Transition *tr;
  Transition *begin;
  Transition target;
  size_t hint;
  undefined8 local_90;
  duration local_88;
  long local_80;
  duration<long,_std::ratio<1L,_1L>_> local_78;
  seconds d;
  year_t shift;
  int_fast64_t diff;
  size_t timecnt;
  int_fast64_t unix_time;
  time_point<seconds> *tp_local;
  TimeZoneInfo *this_local;
  memory_order __b;
  memory_order __b_1;
  
  unix_time_00 = (Transition *)ToUnixSeconds(tp);
  sVar1 = std::
          vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
          ::size(&this->transitions_);
  if (sVar1 != 0) {
    pvVar2 = std::
             vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             ::operator[](&this->transitions_,0);
    if ((long)unix_time_00 < pvVar2->unix_time) {
      tt = std::
           vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
           ::operator[](&this->transition_types_,(ulong)this->default_transition_type_);
      LocalTime(__return_storage_ptr__,this,(int_fast64_t)unix_time_00,tt);
    }
    else {
      pvVar2 = std::
               vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
               ::operator[](&this->transitions_,sVar1 - 1);
      if ((long)unix_time_00 < pvVar2->unix_time) {
        std::operator&(memory_order_relaxed,__memory_order_mask);
        target.prev_civil_sec.f_._8_8_ =
             (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i;
        if ((((target.prev_civil_sec.f_._8_8_ == 0) ||
             (sVar1 <= (ulong)target.prev_civil_sec.f_._8_8_)) ||
            (pvVar2 = std::
                      vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                      ::operator[](&this->transitions_,target.prev_civil_sec.f_._8_8_ - 1),
            (long)unix_time_00 < pvVar2->unix_time)) ||
           (pvVar2 = std::
                     vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                     ::operator[](&this->transitions_,target.prev_civil_sec.f_._8_8_),
           pvVar2->unix_time <= (long)unix_time_00)) {
          target.unix_time._0_1_ = 0;
          begin = unix_time_00;
          detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
          civil_time((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                     &target.type_index);
          detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
          civil_time((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                     &target.civil_sec.f_.m);
          pvVar2 = std::
                   vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ::operator[](&this->transitions_,0);
          pTVar3 = std::
                   upper_bound<absl::lts_20250127::time_internal::cctz::Transition_const*,absl::lts_20250127::time_internal::cctz::Transition,absl::lts_20250127::time_internal::cctz::Transition::ByUnixTime>
                             (pvVar2,pvVar2 + sVar1,&begin);
          std::operator&(memory_order_relaxed,__memory_order_mask);
          (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i =
               ((long)pTVar3 - (long)pvVar2 >> 4) * -0x5555555555555555;
          LocalTime(__return_storage_ptr__,this,(int_fast64_t)unix_time_00,pTVar3 + -1);
        }
        else {
          pvVar2 = std::
                   vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ::operator[](&this->transitions_,target.prev_civil_sec.f_._8_8_ - 1);
          LocalTime(__return_storage_ptr__,this,(int_fast64_t)unix_time_00,pvVar2);
        }
      }
      else if ((this->extended_ & 1U) == 0) {
        pvVar2 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::operator[](&this->transitions_,sVar1 - 1);
        LocalTime(__return_storage_ptr__,this,(int_fast64_t)unix_time_00,pvVar2);
      }
      else {
        pvVar2 = std::
                 vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ::operator[](&this->transitions_,sVar1 - 1);
        d.__r = ((long)unix_time_00 - pvVar2->unix_time) / 0x2f0605980 + 1;
        local_80 = d.__r * 0x2f0605980;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_78,&local_80);
        local_88.__r = (rep)std::chrono::operator-(tp,&local_78);
        (*(this->super_TimeZoneIf)._vptr_TimeZoneIf[2])(__return_storage_ptr__,this,&local_88);
        cVar4 = anon_unknown_0::YearShift(&__return_storage_ptr__->cs,d.__r * 400);
        hint = cVar4.f_.y;
        (__return_storage_ptr__->cs).f_.y = hint;
        local_90 = cVar4.f_._8_8_;
        (__return_storage_ptr__->cs).f_.m = (undefined1)local_90;
        (__return_storage_ptr__->cs).f_.d = local_90._1_1_;
        (__return_storage_ptr__->cs).f_.hh = local_90._2_1_;
        (__return_storage_ptr__->cs).f_.mm = local_90._3_1_;
        (__return_storage_ptr__->cs).f_.ss = local_90._4_1_;
        *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = local_90._5_3_;
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("timecnt != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                ,0x376,
                "virtual time_zone::absolute_lookup absl::time_internal::cctz::TimeZoneInfo::BreakTime(const time_point<seconds> &) const"
               );
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::BreakTime(
    const time_point<seconds>& tp) const {
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  if (unix_time < transitions_[0].unix_time) {
    return LocalTime(unix_time, transition_types_[default_transition_type_]);
  }
  if (unix_time >= transitions_[timecnt - 1].unix_time) {
    // After the last transition. If we extended the transitions using
    // future_spec_, shift back to a supported year using the 400-year
    // cycle of calendaric equivalence and then compensate accordingly.
    if (extended_) {
      const std::int_fast64_t diff =
          unix_time - transitions_[timecnt - 1].unix_time;
      const year_t shift = diff / kSecsPer400Years + 1;
      const auto d = seconds(shift * kSecsPer400Years);
      time_zone::absolute_lookup al = BreakTime(tp - d);
      al.cs = YearShift(al.cs, shift * 400);
      return al;
    }
    return LocalTime(unix_time, transitions_[timecnt - 1]);
  }

  const std::size_t hint = local_time_hint_.load(std::memory_order_relaxed);
  if (0 < hint && hint < timecnt) {
    if (transitions_[hint - 1].unix_time <= unix_time) {
      if (unix_time < transitions_[hint].unix_time) {
        return LocalTime(unix_time, transitions_[hint - 1]);
      }
    }
  }

  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* begin = &transitions_[0];
  const Transition* tr = std::upper_bound(begin, begin + timecnt, target,
                                          Transition::ByUnixTime());
  local_time_hint_.store(static_cast<std::size_t>(tr - begin),
                         std::memory_order_relaxed);
  return LocalTime(unix_time, *--tr);
}